

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Common.cpp
# Opt level: O0

char * StringFromBinary(LPBYTE pbBinary,size_t cbBinary,char *szBuffer)

{
  uchar *puVar1;
  ulong local_30;
  size_t i;
  char *szSaveBuffer;
  char *szBuffer_local;
  size_t cbBinary_local;
  LPBYTE pbBinary_local;
  
  szSaveBuffer = szBuffer;
  if ((pbBinary != (LPBYTE)0x0) && (cbBinary != 0)) {
    cbBinary_local = (size_t)pbBinary;
    for (local_30 = 0; local_30 < cbBinary; local_30 = local_30 + 1) {
      puVar1 = (uchar *)(szSaveBuffer + 1);
      *szSaveBuffer = IntToHexChar[(int)(uint)*(byte *)cbBinary_local >> 4];
      szSaveBuffer = szSaveBuffer + 2;
      *puVar1 = IntToHexChar[(int)(*(byte *)cbBinary_local & 0xf)];
      cbBinary_local = cbBinary_local + 1;
    }
  }
  *szSaveBuffer = '\0';
  return szBuffer;
}

Assistant:

char * StringFromBinary(LPBYTE pbBinary, size_t cbBinary, char * szBuffer)
{
    char * szSaveBuffer = szBuffer;

    // Verify the binary pointer
    if(pbBinary && cbBinary)
    {
        // Convert the string to the array of MD5
        // Copy the blob data as text
        for(size_t i = 0; i < cbBinary; i++)
        {
            *szBuffer++ = IntToHexChar[pbBinary[0] >> 0x04];
            *szBuffer++ = IntToHexChar[pbBinary[0] & 0x0F];
            pbBinary++;
        }
    }

    // Terminate the string
    *szBuffer = 0;
    return szSaveBuffer;
}